

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O3

bool __thiscall indk::Neuron::doSignalSendEntry(Neuron *this,string *From,float X,int64_t tn)

{
  pointer __s2;
  size_t __n;
  bool bVar1;
  int iVar2;
  Computer *pCVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  *e;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  
  ppVar4 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar5) {
    __s2 = (From->_M_dataplus)._M_p;
    __n = From->_M_string_length;
    ppVar6 = ppVar4;
    do {
      if (((ppVar6->first)._M_string_length == __n) &&
         ((__n == 0 || (iVar2 = bcmp((ppVar6->first)._M_dataplus._M_p,__s2,__n), iVar2 == 0)))) {
        Entry::doIn(ppVar6->second,X,tn);
        ppVar4 = (this->Entries).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (this->Entries).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar5);
    for (; ppVar4 != ppVar5; ppVar4 = ppVar4 + 1) {
      bVar1 = Entry::doCheckState(ppVar4->second,tn);
      if (!bVar1) {
        return false;
      }
    }
  }
  pCVar3 = System::getComputeBackend();
  (*pCVar3->_vptr_Computer[3])(pCVar3,this);
  return true;
}

Assistant:

bool indk::Neuron::doSignalSendEntry(const std::string& From, float X, int64_t tn) {
    for (const auto &e: Entries) {
        if (e.first == From) {
            e.second -> doIn(X, tn);
            break;
        }
    }

    for (auto &e: Entries) {
        if (!e.second->doCheckState(tn)) {
//            std::cout << "In to entry of " << Name << " from " << From << " value " << X << " (" << tn << ") - not ready" << std::endl;
            return false;
        }
    }
//    std::cout << "In to entry of " << Name << " from " << From << " value " << X <<  " (" << tn << ") - ready" << std::endl;
    indk::System::getComputeBackend() -> doProcess((void*)this);
    return true;
}